

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,VWReaderHandler<true> *handler)

{
  byte *pbVar1;
  char cVar2;
  char *pcVar3;
  Ch *pCVar4;
  Ch *pCVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  undefined4 uVar9;
  BaseState<true> *pBVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar11;
  byte *pbVar12;
  byte bVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  byte bVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined4 extraout_var;
  
  pcVar3 = is->src_;
  pCVar4 = is->dst_;
  pCVar5 = is->head_;
  cVar2 = *pcVar3;
  pbVar12 = (byte *)(pcVar3 + (cVar2 == '-'));
  bVar13 = pcVar3[cVar2 == '-'];
  if (bVar13 == 0x30) {
    pbVar12 = pbVar12 + 1;
    uVar20 = 0;
    bVar6 = false;
    iVar15 = 0;
    uVar11 = 0;
    goto LAB_001c9964;
  }
  if ((byte)(bVar13 - 0x31) < 9) {
    uVar11 = (ulong)(bVar13 - 0x30);
    bVar13 = pbVar12[1];
    pbVar12 = pbVar12 + 1;
    if (cVar2 == '-') {
      if (9 < (byte)(bVar13 - 0x30)) {
LAB_001c9f4a:
        uVar20 = 0;
        bVar6 = false;
        iVar15 = 0;
        goto LAB_001c9964;
      }
      iVar15 = 0;
      do {
        uVar16 = (uint)uVar11;
        if ((0xccccccb < uVar16) && ('8' < (char)bVar13 || uVar16 != 0xccccccc)) goto LAB_001c995c;
        uVar11 = (ulong)(((uint)bVar13 + uVar16 * 10) - 0x30);
        iVar15 = iVar15 + 1;
        bVar13 = pbVar12[1];
        pbVar12 = pbVar12 + 1;
      } while ((byte)(bVar13 - 0x30) < 10);
    }
    else {
      if (9 < (byte)(bVar13 - 0x30)) goto LAB_001c9f4a;
      iVar15 = 0;
      do {
        uVar16 = (uint)uVar11;
        if ((0x19999998 < uVar16) && ('5' < (char)bVar13 || uVar16 != 0x19999999))
        goto LAB_001c995c;
        uVar11 = (ulong)(((uint)bVar13 + uVar16 * 10) - 0x30);
        iVar15 = iVar15 + 1;
        bVar13 = pbVar12[1];
        pbVar12 = pbVar12 + 1;
      } while ((byte)(bVar13 - 0x30) < 10);
    }
    bVar6 = false;
    uVar20 = 0;
    goto LAB_001c9964;
  }
  lVar21 = (long)pbVar12 - (long)pCVar5;
  uVar9 = 3;
  goto LAB_001c9d5b;
LAB_001c995c:
  bVar6 = true;
  uVar20 = uVar11;
LAB_001c9964:
  dVar23 = 0.0;
  if (bVar6) {
    bVar13 = *pbVar12;
    bVar18 = bVar13 - 0x30;
    if (cVar2 == '-') {
      while (bVar18 < 10) {
        if ((0xccccccccccccccb < uVar20) && (uVar20 != 0xccccccccccccccc || '8' < (char)bVar13))
        goto LAB_001c9a41;
        uVar20 = (ulong)(bVar13 & 0xf) + uVar20 * 10;
        iVar15 = iVar15 + 1;
        bVar13 = pbVar12[1];
        pbVar12 = pbVar12 + 1;
        bVar18 = bVar13 - 0x30;
      }
    }
    else {
      while (bVar18 < 10) {
        if ((0x1999999999999998 < uVar20) && (uVar20 != 0x1999999999999999 || '5' < (char)bVar13))
        goto LAB_001c9a41;
        uVar20 = (ulong)(bVar13 & 0xf) + uVar20 * 10;
        iVar15 = iVar15 + 1;
        bVar13 = pbVar12[1];
        pbVar12 = pbVar12 + 1;
        bVar18 = bVar13 - 0x30;
      }
    }
  }
  bVar7 = false;
  goto LAB_001c9a6a;
LAB_001c9a41:
  auVar25._8_4_ = (int)(uVar20 >> 0x20);
  auVar25._0_8_ = uVar20;
  auVar25._12_4_ = 0x45300000;
  dVar23 = (auVar25._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar20) - 4503599627370496.0);
  bVar7 = true;
LAB_001c9a6a:
  lVar21 = (long)pcVar3 - (long)pCVar5;
  if (bVar7) {
    bVar13 = *pbVar12;
    while ((byte)(bVar13 - 0x30) < 10) {
      if (1.7976931348623158e+307 <= dVar23) {
        uVar9 = 0xd;
        goto LAB_001c9d5b;
      }
      dVar23 = dVar23 * 10.0 + (double)((char)*pbVar12 + -0x30);
      bVar13 = pbVar12[1];
      pbVar12 = pbVar12 + 1;
    }
  }
  bVar13 = *pbVar12;
  pbVar12 = pbVar12 + (bVar13 == 0x2e);
  iVar19 = 0;
  if (bVar13 == 0x2e) {
    if (0xf5 < (byte)(*pbVar12 - 0x3a)) {
      iVar19 = 0;
      if (!bVar7) {
        uVar17 = uVar11;
        if (bVar6) {
          uVar17 = uVar20;
        }
        uVar20 = uVar17;
        bVar13 = *pbVar12;
        iVar19 = 0;
        if ((0xf5 < (byte)(bVar13 - 0x3a)) && (uVar20 < 0x20000000000000)) {
          lVar14 = 0;
          do {
            uVar20 = (ulong)(bVar13 & 0xf) + uVar20 * 10;
            iVar15 = (uint)(uVar20 != 0) + iVar15;
            bVar13 = pbVar12[lVar14 + 1];
            lVar14 = lVar14 + 1;
            if ((byte)(bVar13 - 0x3a) < 0xf6) break;
          } while (uVar20 < 0x20000000000000);
          iVar19 = -(int)lVar14;
          pbVar12 = pbVar12 + lVar14;
        }
        auVar26._8_4_ = (int)(uVar20 >> 0x20);
        auVar26._0_8_ = uVar20;
        auVar26._12_4_ = 0x45300000;
        dVar23 = (auVar26._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar20) - 4503599627370496.0);
        bVar7 = true;
      }
      bVar13 = *pbVar12;
      while ((byte)(bVar13 - 0x30) < 10) {
        if (iVar15 < 0x11) {
          dVar23 = dVar23 * 10.0 + (double)(int)(bVar13 - 0x30);
          iVar19 = iVar19 + -1;
          if (0.0 < dVar23) {
            iVar15 = iVar15 + 1;
          }
        }
        pbVar1 = pbVar12 + 1;
        pbVar12 = pbVar12 + 1;
        bVar13 = *pbVar1;
      }
      goto LAB_001c9bf1;
    }
    lVar21 = (long)pbVar12 - (long)pCVar5;
    uVar9 = 0xe;
  }
  else {
LAB_001c9bf1:
    bVar13 = *pbVar12;
    pbVar12 = pbVar12 + (bVar13 == 0x65);
    if (bVar13 == 0x65) {
LAB_001c9c29:
      uVar17 = uVar11;
      if (bVar6) {
        uVar17 = uVar20;
      }
      if (!bVar7) {
        auVar27._8_4_ = (int)(uVar17 >> 0x20);
        auVar27._0_8_ = uVar17;
        auVar27._12_4_ = 0x45300000;
        dVar23 = (auVar27._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar17) - 4503599627370496.0);
        bVar7 = true;
      }
      bVar13 = *pbVar12;
      pbVar12 = pbVar12 + (bVar13 == 0x2b);
      if (bVar13 == 0x2b) {
        bVar22 = false;
      }
      else {
        bVar22 = *pbVar12 == 0x2d;
        pbVar12 = pbVar12 + bVar22;
      }
      bVar13 = *pbVar12;
      if ((byte)(bVar13 - 0x30) < 10) {
        pbVar12 = pbVar12 + 1;
        iVar15 = bVar13 - 0x30;
        if (bVar22) {
          bVar13 = *pbVar12;
          while ((byte)(bVar13 - 0x30) < 10) {
            iVar15 = (uint)bVar13 + iVar15 * 10 + -0x30;
            if (iVar15 < 0xccccccc) {
              pbVar12 = pbVar12 + 1;
            }
            else {
              do {
                pbVar1 = pbVar12 + 1;
                pbVar12 = pbVar12 + 1;
              } while ((byte)(*pbVar1 - 0x30) < 10);
            }
            bVar13 = *pbVar12;
          }
        }
        else {
          do {
            bVar13 = *pbVar12;
            bVar18 = bVar13 - 0x30;
            if (9 < bVar18) goto LAB_001c9d45;
            pbVar12 = pbVar12 + 1;
            iVar15 = (uint)bVar13 + iVar15 * 10 + -0x30;
          } while (iVar15 <= 0x134 - iVar19);
          *(undefined4 *)(this + 0x30) = 0xd;
          *(long *)(this + 0x38) = lVar21;
LAB_001c9d45:
          if (bVar18 < 10) {
            bVar22 = false;
            goto LAB_001c9d83;
          }
        }
        iVar8 = -iVar15;
        if (!bVar22) {
          iVar8 = iVar15;
        }
        iVar15 = iVar8;
        bVar22 = true;
      }
      else {
        *(undefined4 *)(this + 0x30) = 0xf;
        *(long *)(this + 0x38) = (long)pbVar12 - (long)pCVar5;
        bVar22 = false;
        iVar15 = 0;
      }
LAB_001c9d83:
      if (!bVar22) goto LAB_001c9eb2;
    }
    else {
      bVar13 = *pbVar12;
      pbVar12 = pbVar12 + (bVar13 == 0x45);
      iVar15 = 0;
      if (bVar13 == 0x45) goto LAB_001c9c29;
    }
    if (bVar7) {
      uVar16 = iVar15 + iVar19;
      if ((int)uVar16 < -0x134) {
        dVar24 = 0.0;
        if (-0x269 < (int)uVar16) {
          dVar24 = (dVar23 / 1e+308) /
                   *(double *)(internal::Pow10(int)::e + (ulong)(-uVar16 - 0x134) * 8);
        }
      }
      else if ((int)uVar16 < 0) {
        dVar24 = dVar23 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar16 * 8);
      }
      else {
        dVar24 = dVar23 * *(double *)(internal::Pow10(int)::e + (ulong)uVar16 * 8);
      }
      if (cVar2 == '-') {
        dVar24 = -dVar24;
      }
      iVar15 = (*((handler->ctx).current_state)->_vptr_BaseState[2])((ulong)(uint)(float)dVar24);
      pBVar10 = (BaseState<true> *)CONCAT44(extraout_var_02,iVar15);
    }
    else if (bVar6) {
      if (cVar2 == '-') {
        iVar15 = (*((handler->ctx).current_state)->_vptr_BaseState[2])
                           ((ulong)(uint)(float)(long)-uVar20);
        pBVar10 = (BaseState<true> *)CONCAT44(extraout_var,iVar15);
      }
      else {
        pBVar10 = (handler->ctx).current_state;
        iVar15 = (*pBVar10->_vptr_BaseState[2])((ulong)(uint)(float)uVar20,pBVar10,handler);
        pBVar10 = (BaseState<true> *)CONCAT44(extraout_var_03,iVar15);
      }
    }
    else if (cVar2 == '-') {
      iVar15 = (*((handler->ctx).current_state)->_vptr_BaseState[2])
                         ((ulong)(uint)(float)-(int)uVar11);
      pBVar10 = (BaseState<true> *)CONCAT44(extraout_var_00,iVar15);
    }
    else {
      iVar15 = (*((handler->ctx).current_state)->_vptr_BaseState[3])();
      pBVar10 = (BaseState<true> *)CONCAT44(extraout_var_01,iVar15);
    }
    if (pBVar10 != (BaseState<true> *)0x0) {
      (handler->ctx).previous_state = (handler->ctx).current_state;
      (handler->ctx).current_state = pBVar10;
      goto LAB_001c9eb2;
    }
    uVar9 = 0x10;
  }
LAB_001c9d5b:
  *(undefined4 *)(this + 0x30) = uVar9;
  *(long *)(this + 0x38) = lVar21;
LAB_001c9eb2:
  is->src_ = (Ch *)pbVar12;
  is->dst_ = pCVar4;
  is->head_ = pCVar5;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler)
  { internal::StreamLocalCopy<InputStream> copy(is);
    NumberStream<InputStream,
                 ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                 ((parseFlags & kParseInsituFlag) == 0) :
                 ((parseFlags & kParseFullPrecisionFlag) != 0),
                 (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                 (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

    size_t startOffset = s.Tell();
    double d = 0.0;
    bool useNanOrInf = false;

    // Parse minus
    bool minus = Consume(s, '-');

    // Parse int: zero / ( digit1-9 *DIGIT )
    unsigned i = 0;
    uint64_t i64 = 0;
    bool use64bit = false;
    int significandDigit = 0;
    if (RAPIDJSON_UNLIKELY(s.Peek() == '0'))
    { i = 0;
      s.TakePush();
    }
    else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9'))
    { i = static_cast<unsigned>(s.TakePush() - '0');

      if (minus)
        while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9'))
        { if (RAPIDJSON_UNLIKELY(i >= 214748364))   // 2^31 = 2147483648
          { if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8'))
            { i64 = i;
              use64bit = true;
              break;
            }
          }
          i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
          significandDigit++;
        }
      else
        while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9'))
        { if (RAPIDJSON_UNLIKELY(i >= 429496729))   // 2^32 - 1 = 4294967295
          { if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5'))
            { i64 = i;
              use64bit = true;
              break;
            }
          }
          i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
          significandDigit++;
        }
    }
    // Parse NaN or Infinity here
    else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N')))
    { useNanOrInf = true;
      if (RAPIDJSON_LIKELY(Consume(s, 'N') && Consume(s, 'a') && Consume(s, 'N')))
      { d = std::numeric_limits<double>::quiet_NaN();
      }
      else if (RAPIDJSON_LIKELY(Consume(s, 'I') && Consume(s, 'n') && Consume(s, 'f')))
      { d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
        if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                               && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y'))))
          RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
      }
      else
        RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
    }
    else
      RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

    // Parse 64bit int
    bool useDouble = false;
    if (use64bit)
    { if (minus)
        while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9'))
        { if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
            if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8'))
            { d = static_cast<double>(i64);
              useDouble = true;
              break;
            }
          i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
          significandDigit++;
        }
      else
        while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9'))
        { if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
            if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5'))
            { d = static_cast<double>(i64);
              useDouble = true;
              break;
            }
          i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
          significandDigit++;
        }
    }

    // Force double for big integer
    if (useDouble)
    { while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9'))
      { if (RAPIDJSON_UNLIKELY(d >= 1.7976931348623157e307)) // DBL_MAX / 10.0
          RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
        d = d * 10 + (s.TakePush() - '0');
      }
    }

    // Parse frac = decimal-point 1*DIGIT
    int expFrac = 0;
    size_t decimalPosition;
    if (Consume(s, '.'))
    { decimalPosition = s.Length();

      if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
        RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

      if (!useDouble)
      {
#if RAPIDJSON_64BIT
        // Use i64 to store significand in 64-bit architecture
        if (!use64bit)
          i64 = i;

        while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9'))
        { if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
            break;
          else
          { i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
            --expFrac;
            if (i64 != 0)
              significandDigit++;
          }
        }

        d = static_cast<double>(i64);
#else
        // Use double to store significand in 32-bit architecture
        d = static_cast<double>(use64bit ? i64 : i);
#endif
        useDouble = true;
      }

      while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9'))
      { if (significandDigit < 17)
        { d = d * 10.0 + (s.TakePush() - '0');
          --expFrac;
          if (RAPIDJSON_LIKELY(d > 0.0))
            significandDigit++;
        }
        else
          s.TakePush();
      }
    }
    else
      decimalPosition = s.Length(); // decimal position at the end of integer.

    // Parse exp = e [ minus / plus ] 1*DIGIT
    int exp = 0;
    if (Consume(s, 'e') || Consume(s, 'E'))
    { if (!useDouble)
      { d = static_cast<double>(use64bit ? i64 : i);
        useDouble = true;
      }

      bool expMinus = false;
      if (Consume(s, '+'))
        ;
      else if (Consume(s, '-'))
        expMinus = true;

      if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9'))
      { exp = static_cast<int>(s.Take() - '0');
        if (expMinus)
        { while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9'))
          { exp = exp * 10 + static_cast<int>(s.Take() - '0');
            if (exp >= 214748364)                           // Issue #313: prevent overflow exponent
            { while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                s.Take();
            }
          }
        }
        else    // positive exp
        { int maxExp = 308 - expFrac;
          while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9'))
          { exp = exp * 10 + static_cast<int>(s.Take() - '0');
            if (RAPIDJSON_UNLIKELY(exp > maxExp))
              RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
          }
        }
      }
      else
        RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

      if (expMinus)
        exp = -exp;
    }

    // Finish parsing, call event according to the type of number.
    bool cont = true;

    if (parseFlags & kParseNumbersAsStringsFlag)
    { if (parseFlags & kParseInsituFlag)
      { s.Pop();  // Pop stack no matter if it will be used or not.
        typename InputStream::Ch* head = is.PutBegin();
        const size_t length = s.Tell() - startOffset;
        RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
        // unable to insert the \0 character here, it will erase the comma after this number
        const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
        cont = handler.RawNumber(str, SizeType(length), false);
      }
      else
      { SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
        StringStream srcStream(s.Pop());
        StackStream<typename TargetEncoding::Ch> dstStream(stack_);
        while (numCharsToCopy--)
        { Transcoder<UTF8<>, TargetEncoding>::Transcode(srcStream, dstStream);
        }
        dstStream.Put('\0');
        const typename TargetEncoding::Ch* str = dstStream.Pop();
        const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
        cont = handler.RawNumber(str, SizeType(length), true);
      }
    }
    else
    { size_t length = s.Length();
      const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

      if (useDouble)
      { int p = exp + expFrac;
        if (parseFlags & kParseFullPrecisionFlag)
          d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
        else
          d = internal::StrtodNormalPrecision(d, p);

        cont = handler.Double(minus ? -d : d);
      }
      else if (useNanOrInf)
      { cont = handler.Double(d);
      }
      else
      { if (use64bit)
        { if (minus)
            cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
          else
            cont = handler.Uint64(i64);
        }
        else
        { if (minus)
            cont = handler.Int(static_cast<int32_t>(~i + 1));
          else
            cont = handler.Uint(i);
        }
      }
    }
    if (RAPIDJSON_UNLIKELY(!cont))
      RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
  }